

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

bool __thiscall
capnp::SchemaLoader::CompatibilityChecker::shouldReplace
          (CompatibilityChecker *this,Reader *existingNode,Reader *replacement,
          bool preferReplacementIfEquivalent)

{
  SegmentReader *pSVar1;
  CapTableReader *pCVar2;
  void *pvVar3;
  WirePointer *pWVar4;
  StructPointerCount SVar5;
  undefined2 uVar6;
  int iVar7;
  undefined4 uVar8;
  StructDataBitCount SVar9;
  bool bVar10;
  ArrayPtr<const_char> AVar11;
  anon_class_8_1_47aff82b _kjContextFunc632;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:631:5)>
  _kjContext632;
  Reader *local_a8;
  Context local_a0;
  undefined1 *local_58;
  PointerReader local_50;
  
  pSVar1 = (existingNode->_reader).segment;
  pCVar2 = (existingNode->_reader).capTable;
  pvVar3 = (existingNode->_reader).data;
  pWVar4 = (existingNode->_reader).pointers;
  SVar5 = (existingNode->_reader).pointerCount;
  uVar6 = *(undefined2 *)&(existingNode->_reader).field_0x26;
  iVar7 = (existingNode->_reader).nestingLimit;
  uVar8 = *(undefined4 *)&(existingNode->_reader).field_0x2c;
  (this->existingNode)._reader.dataSize = (existingNode->_reader).dataSize;
  (this->existingNode)._reader.pointerCount = SVar5;
  *(undefined2 *)&(this->existingNode)._reader.field_0x26 = uVar6;
  (this->existingNode)._reader.nestingLimit = iVar7;
  *(undefined4 *)&(this->existingNode)._reader.field_0x2c = uVar8;
  (this->existingNode)._reader.data = pvVar3;
  (this->existingNode)._reader.pointers = pWVar4;
  (this->existingNode)._reader.segment = pSVar1;
  (this->existingNode)._reader.capTable = pCVar2;
  pCVar2 = (replacement->_reader).capTable;
  pvVar3 = (replacement->_reader).data;
  pWVar4 = (replacement->_reader).pointers;
  SVar9 = (replacement->_reader).dataSize;
  SVar5 = (replacement->_reader).pointerCount;
  uVar6 = *(undefined2 *)&(replacement->_reader).field_0x26;
  iVar7 = (replacement->_reader).nestingLimit;
  uVar8 = *(undefined4 *)&(replacement->_reader).field_0x2c;
  (this->replacementNode)._reader.segment = (replacement->_reader).segment;
  (this->replacementNode)._reader.capTable = pCVar2;
  (this->replacementNode)._reader.data = pvVar3;
  (this->replacementNode)._reader.pointers = pWVar4;
  (this->replacementNode)._reader.dataSize = SVar9;
  (this->replacementNode)._reader.pointerCount = SVar5;
  *(undefined2 *)&(this->replacementNode)._reader.field_0x26 = uVar6;
  (this->replacementNode)._reader.nestingLimit = iVar7;
  *(undefined4 *)&(this->replacementNode)._reader.field_0x2c = uVar8;
  local_a8 = existingNode;
  kj::_::Debug::Context::Context(&local_a0);
  local_a0.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)&PTR__Context_001ca120;
  if ((existingNode->_reader).pointerCount == 0) {
    local_50.nestingLimit = 0x7fffffff;
    local_50.capTable = (CapTableReader *)0x0;
    local_50.pointer = (WirePointer *)0x0;
    local_50.segment = (SegmentReader *)0x0;
  }
  else {
    local_50.segment = (existingNode->_reader).segment;
    local_50.capTable = (existingNode->_reader).capTable;
    local_50.pointer = (existingNode->_reader).pointers;
    local_50.nestingLimit = (existingNode->_reader).nestingLimit;
  }
  local_58 = (undefined1 *)&local_a8;
  AVar11 = (ArrayPtr<const_char>)_::PointerReader::getBlob<capnp::Text>(&local_50,(void *)0x0,0);
  (this->nodeName).super_StringPtr.content = AVar11;
  this->compatibility = EQUIVALENT;
  checkCompatibility(this,existingNode,replacement);
  bVar10 = this->compatibility == NEWER;
  if (preferReplacementIfEquivalent) {
    bVar10 = this->compatibility != OLDER;
  }
  kj::_::Debug::Context::~Context(&local_a0);
  return bVar10;
}

Assistant:

bool shouldReplace(const schema::Node::Reader& existingNode,
                     const schema::Node::Reader& replacement,
                     bool preferReplacementIfEquivalent) {
    this->existingNode = existingNode;
    this->replacementNode = replacement;

    KJ_CONTEXT("checking compatibility with previously-loaded node of the same id",
               existingNode.getDisplayName());

    KJ_DREQUIRE(existingNode.getId() == replacement.getId());

    nodeName = existingNode.getDisplayName();
    compatibility = EQUIVALENT;

    checkCompatibility(existingNode, replacement);

    // Prefer the newer schema.
    return preferReplacementIfEquivalent ? compatibility != OLDER : compatibility == NEWER;
  }